

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O3

Time helics::fileops::loadTomlTime(value *timeElement,time_units defaultUnits)

{
  string_view unitString;
  string_view unitString_00;
  time_units tVar1;
  Time TVar2;
  enable_if_t<detail::is_chrono_duration<duration<long,_ratio<1L,_1000000000L>_>_>::value,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  eVar3;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  pbVar4;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  integer_type *piVar5;
  TimeRepresentation<count_time<9,_long>_> TVar6;
  floating_type *pfVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  value *in_RDX;
  value *element;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar10;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar11;
  double dVar12;
  string_view timeString;
  string_view timeString_00;
  value emptyVal;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  size_t in_stack_fffffffffffffdd8;
  _Alloc_hider in_stack_fffffffffffffde0;
  _Alloc_hider _Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *local_200;
  utilities *local_1f8;
  char *local_1f0;
  undefined1 auStack_1e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  undefined1 local_1c0 [72];
  region local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_110;
  basic_value<toml::type_config> local_f8;
  
  if (timeElement->type_ - 2 < 9) {
    peVar11 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
              (ulong)defaultUnits;
    switch((uint)timeElement->type_) {
    case 2:
      piVar5 = toml::basic_value<toml::type_config>::as_integer(timeElement);
      TVar2.internalTimeCode = count_time<9,_long>::fromCount(*piVar5,defaultUnits);
      return (Time)TVar2.internalTimeCode;
    case 3:
      TVar6.internalTimeCode = -0x7fffffffffffffff;
      pfVar7 = toml::basic_value<toml::type_config>::as_floating(timeElement);
      dVar12 = *pfVar7 * timeCountReverse[(int)defaultUnits];
      if (-9223372036.854765 < dVar12) {
        if (9223372036.854765 <= dVar12) {
          TVar6.internalTimeCode = 0x7fffffffffffffff;
        }
        else {
          TVar6.internalTimeCode =
               (baseType)
               (dVar12 * 1000000000.0 +
               *(double *)(&DAT_003d3040 + (ulong)(0.0 <= dVar12 * 1000000000.0) * 8));
        }
      }
      break;
    default:
      goto switchD_0035c740_caseD_4;
    case 8:
      eVar3 = toml::get<std::chrono::duration<long,std::ratio<1l,1000000000l>>,toml::type_config>
                        (timeElement);
      return (Time)eVar3.__r;
    case 10:
      pbVar4 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                         (timeElement,(char (*) [5])0x3fa131,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          emptyString_abi_cxx11_);
      if (pbVar4->_M_string_length != 0) {
        unitString._M_str = in_stack_fffffffffffffde0._M_p;
        unitString._M_len = in_stack_fffffffffffffdd8;
        tVar1 = gmlc::utilities::timeUnitsFromString(unitString);
        peVar11 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                   *)(ulong)tVar1;
      }
      pbVar4 = toml::find_or<std::__cxx11::string,toml::type_config,char[6]>
                         (timeElement,(char (*) [6])0x3fbd2c,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          emptyString_abi_cxx11_);
      if (pbVar4->_M_string_length != 0) {
        unitString_00._M_str = in_stack_fffffffffffffde0._M_p;
        unitString_00._M_len = in_stack_fffffffffffffdd8;
        tVar1 = gmlc::utilities::timeUnitsFromString(unitString_00);
        peVar11 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                   *)(ulong)tVar1;
      }
      toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_1c0)
      ;
      v = toml::find_or<toml::type_config,char[6]>
                    (timeElement,(char (*) [6])0x3f8ab9,(basic_value<toml::type_config> *)local_1c0)
      ;
      toml::basic_value<toml::type_config>::basic_value(&local_f8,v);
      TVar6.internalTimeCode = -0x7fffffffffffffff;
      if (local_f8.type_ != empty) {
        if (local_f8.type_ == floating) {
          pfVar7 = toml::basic_value<toml::type_config>::as_floating(&local_f8);
          dVar12 = *pfVar7 * timeCountReverse[(int)(time_units)peVar11];
          if (-9223372036.854765 < dVar12) {
            if (9223372036.854765 <= dVar12) {
              TVar6.internalTimeCode = 0x7fffffffffffffff;
            }
            else {
              TVar6.internalTimeCode =
                   (baseType)
                   (dVar12 * 1000000000.0 +
                   *(double *)(&DAT_003d3040 + (ulong)(0.0 <= dVar12 * 1000000000.0) * 8));
            }
          }
        }
        else if (local_f8.type_ == integer) {
          piVar5 = toml::basic_value<toml::type_config>::as_integer(&local_f8);
          TVar6.internalTimeCode = count_time<9,_long>::fromCount(*piVar5,(time_units)peVar11);
          v = peVar11;
        }
        else {
          tomlAsString_abi_cxx11_((string *)(auStack_1e8 + 8),(fileops *)&local_f8,element);
          pbVar8 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (auStack_1e8 + 8)," ");
          _Var13._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar9 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var13._M_p == paVar9) {
            local_210._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_210._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            _Var13._M_p = (pointer)&local_210;
          }
          else {
            local_210._M_allocated_capacity = paVar9->_M_allocated_capacity;
          }
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          pbVar8 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &stack0xfffffffffffffde0,(pbVar4->_M_dataplus)._M_p,
                              pbVar4->_M_string_length);
          v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
              (pbVar8->_M_dataplus)._M_p;
          paVar9 = &pbVar8->field_2;
          if (v == (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                    *)paVar9) {
            local_1f0 = (char *)paVar9->_M_allocated_capacity;
            auStack_1e8._0_8_ = *(value_type_conflict4 *)((long)&pbVar8->field_2 + 8);
            pcVar10 = extraout_RDX_00;
            v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)&local_1f0;
          }
          else {
            pcVar10 = (char *)paVar9->_M_allocated_capacity;
            local_1f0 = pcVar10;
          }
          local_1f8 = (utilities *)pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          timeString_00._M_str = pcVar10;
          timeString_00._M_len = (size_t)v;
          local_200 = v;
          TVar6 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                            (local_1f8,timeString_00);
          if (local_200 !=
              (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
              &local_1f0) {
            v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)(local_1f0 + 1);
            operator_delete(local_200,(ulong)v);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var13._M_p != &local_210) {
            v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)(local_210._M_allocated_capacity + 1);
            operator_delete(_Var13._M_p,(ulong)v);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)auStack_1e8._8_8_ != &local_1d0) {
            v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)(local_1d0._M_allocated_capacity + 1);
            operator_delete((void *)auStack_1e8._8_8_,(ulong)v);
          }
        }
      }
      toml::basic_value<toml::type_config>::cleanup(&local_f8,(EVP_PKEY_CTX *)v);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8.comments_);
      toml::detail::region::~region(&local_f8.region_);
      toml::basic_value<toml::type_config>::cleanup
                ((basic_value<toml::type_config> *)local_1c0,(EVP_PKEY_CTX *)v);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_110);
      toml::detail::region::~region(&local_178);
    }
  }
  else {
switchD_0035c740_caseD_4:
    tomlAsString_abi_cxx11_((string *)local_1c0,(fileops *)timeElement,in_RDX);
    timeString._M_str = extraout_RDX;
    timeString._M_len = local_1c0._0_8_;
    TVar6 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                      ((utilities *)local_1c0._8_8_,timeString);
    if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
      operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
    }
  }
  return (Time)TVar6.internalTimeCode;
}

Assistant:

helics::Time loadTomlTime(const toml::value& timeElement, time_units defaultUnits)
{
    if (timeElement.is_table()) {
        const auto& unit = toml::find_or<std::string>(timeElement, "unit", emptyString);
        if (!unit.empty()) {
            defaultUnits = gmlc::utilities::timeUnitsFromString(unit);
        }
        const auto& units = toml::find_or<std::string>(timeElement, "units", emptyString);
        if (!units.empty()) {
            defaultUnits = gmlc::utilities::timeUnitsFromString(units);
        }
        const toml::value emptyVal;
        auto val = toml::find_or(timeElement, "value", emptyVal);
        if (!val.is_empty()) {
            if (val.is_integer()) {
                return {val.as_integer(), defaultUnits};
            }
            if (val.is_floating()) {
                return {val.as_floating() * toSecondMultiplier(defaultUnits)};
            }
            return gmlc::utilities::loadTimeFromString<helics::Time>(tomlAsString(val) + " " +
                                                                     units);
        }
    } else if (timeElement.is_integer()) {
        return {timeElement.as_integer(), defaultUnits};
    } else if (timeElement.is_floating()) {
        return {timeElement.as_floating() * toSecondMultiplier(defaultUnits)};
    } else if (timeElement.is_local_time()) {
        return {toml::get<std::chrono::nanoseconds>(timeElement)};
    } else {
        return gmlc::utilities::loadTimeFromString<helics::Time>(tomlAsString(timeElement));
    }
    return helics::Time::minVal();
}